

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void __thiscall UtilTest_byteswap_Test::TestBody(UtilTest_byteswap_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  long *local_28;
  undefined1 *local_20;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_28 = (long *)CONCAT62(local_28._2_6_,0x3412);
  local_20 = (undefined1 *)CONCAT62(local_20._2_6_,0x3412);
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            (local_18,"byteswap(uint16_t{0x1234})","uint16_t{0x3412}",(unsigned_short *)&local_28,
             (unsigned_short *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_28 + 2),"hex: ",5);
    *(uint *)((long)local_28 + *(long *)(local_28[2] + -0x18) + 0x28) =
         *(uint *)((long)local_28 + *(long *)(local_28[2] + -0x18) + 0x28) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)(local_28 + 2));
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = (long *)CONCAT44(local_28._4_4_,0x78563412);
  local_20 = (undefined1 *)CONCAT44(local_20._4_4_,0x78563412);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_18,"byteswap(uint32_t{0x12345678UL})","uint32_t{0x78563412UL}",(uint *)&local_28,
             (uint *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_28 + 2),"hex: ",5);
    *(uint *)((long)local_28 + *(long *)(local_28[2] + -0x18) + 0x28) =
         *(uint *)((long)local_28 + *(long *)(local_28[2] + -0x18) + 0x28) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)(local_28 + 2));
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x25,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28 = (long *)&DAT_f0debc9a78563412;
  local_20 = &DAT_f0debc9a78563412;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"byteswap(uint64_t{0x123456789ABCDEF0ULL})","uint64_t{0xF0DEBC9A78563412ULL}",
             (unsigned_long *)&local_28,(unsigned_long *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_28 + 2),"hex: ",5);
    *(uint *)((long)local_28 + *(long *)(local_28[2] + -0x18) + 0x28) =
         *(uint *)((long)local_28 + *(long *)(local_28[2] + -0x18) + 0x28) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)(local_28 + 2));
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x27,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  return;
}

Assistant:

TEST(UtilTest, byteswap) {
	EXPECT_EQ(byteswap(uint16_t{0x1234}), uint16_t{0x3412})
		<< "hex: " << std::hex << byteswap(uint16_t{0x1234});
	EXPECT_EQ(byteswap(uint32_t{0x12345678UL}), uint32_t{0x78563412UL})
		<< "hex: " << std::hex << byteswap(uint32_t{0x12345678UL});
	EXPECT_EQ(byteswap(uint64_t{0x123456789ABCDEF0ULL}), uint64_t{0xF0DEBC9A78563412ULL})
		<< "hex: " << std::hex << byteswap(uint64_t{0x123456789ABCDEF0ULL});
}